

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

string * __thiscall
libchars::commands::value_abi_cxx11_(string *__return_storage_ptr__,commands *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->super_edit_object).buflen != 0) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)(this->super_edit_object).buffer);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string commands::value() const
    {
        std::string str;
        if (length() > 0 && data() != NULL)
            str.assign(data(),length());
        return str;
    }